

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_decoder.c
# Opt level: O0

lzma_ret lzma_properties_decode
                   (lzma_filter *filter,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  lzma_filter_decoder *plVar1;
  lzma_filter_decoder *fd;
  size_t props_size_local;
  uint8_t *props_local;
  lzma_allocator *allocator_local;
  lzma_filter *filter_local;
  
  plVar1 = decoder_find(filter->id);
  filter->options = (void *)0x0;
  if (plVar1 == (lzma_filter_decoder *)0x0) {
    filter_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  else if (plVar1->props_decode ==
           (_func_lzma_ret_void_ptr_ptr_lzma_allocator_ptr_uint8_t_ptr_size_t *)0x0) {
    filter_local._4_4_ = LZMA_OPTIONS_ERROR;
    if (props_size == 0) {
      filter_local._4_4_ = LZMA_OK;
    }
  }
  else {
    filter_local._4_4_ = (*plVar1->props_decode)(&filter->options,allocator,props,props_size);
  }
  return filter_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_properties_decode(lzma_filter *filter, lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	const lzma_filter_decoder *const fd = decoder_find(filter->id);

	// Make it always NULL so that the caller can always safely free() it.
	filter->options = NULL;

	if (fd == NULL)
		return LZMA_OPTIONS_ERROR;

	if (fd->props_decode == NULL)
		return props_size == 0 ? LZMA_OK : LZMA_OPTIONS_ERROR;

	return fd->props_decode(
			&filter->options, allocator, props, props_size);
}